

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandAbs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int c;
  Wlc_Par_t *pPars;
  Wlc_Par_t Pars;
  Wlc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars.pFuncStop = (_func_int_int *)Wlc_AbcGetNtk(pAbc);
  Wlc_ManSetDefaultParams((Wlc_Par_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_003e52f4:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"AMXFILdxvwh");
    if (iVar1 == -1) {
      if (Pars.pFuncStop == (_func_int_int *)0x0) {
        Abc_Print(1,"Abc_CommandCone(): There is no current design.\n");
        return 0;
      }
      Wlc_NtkAbsCore((Wlc_Ntk_t *)Pars.pFuncStop,(Wlc_Par_t *)&pPars);
      return 0;
    }
    switch(iVar1) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
        goto LAB_003e5694;
      }
      pPars._0_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = (uint)pPars;
      break;
    default:
      goto LAB_003e5694;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_003e5694;
      }
      Pars.nBitsMul = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nBitsMul;
      break;
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_003e5694;
      }
      Pars.nBitsMux = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nBitsMux;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_003e5694;
      }
      Pars.nBitsFlop = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nBitsFlop;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_003e5694;
      }
      pPars._4_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = pPars._4_4_;
      break;
    case 0x58:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-X\" should be followed by an integer.\n");
        goto LAB_003e5694;
      }
      Pars.nBitsAdd = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nBitsAdd;
      break;
    case 100:
      Pars.fHybrid = Pars.fHybrid ^ 1;
      goto LAB_003e52f4;
    case 0x68:
      goto LAB_003e5694;
    case 0x76:
      Pars.fShrinkAbs = Pars.fShrinkAbs ^ 1;
      goto LAB_003e52f4;
    case 0x77:
      Pars.fShrinkScratch = Pars.fShrinkScratch ^ 1;
      goto LAB_003e52f4;
    case 0x78:
      Pars.nIterMax = Pars.nIterMax ^ 1;
      goto LAB_003e52f4;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_003e5694:
      Abc_Print(-2,"usage: %%abs [-AMXFIL num] [-dxvwh]\n");
      Abc_Print(-2,"\t         abstraction for word-level networks\n");
      Abc_Print(-2,
                "\t-A num : minimum bit-width of an adder/subtractor to abstract [default = %d]\n",
                (ulong)(uint)pPars);
      Abc_Print(-2,"\t-M num : minimum bit-width of a multiplier to abstract [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-X num : minimum bit-width of a MUX operator to abstract [default = %d]\n",
                (ulong)(uint)Pars.nBitsAdd);
      Abc_Print(-2,"\t-F num : minimum bit-width of a flip-flop to abstract [default = %d]\n",
                (ulong)(uint)Pars.nBitsMul);
      Abc_Print(-2,"\t-I num : maximum number of CEGAR iterations [default = %d]\n",
                (ulong)(uint)Pars.nBitsMux);
      Abc_Print(-2,"\t-L num : maximum number of each type of signals [default = %d]\n",
                (ulong)(uint)Pars.nBitsFlop);
      pcVar3 = "no";
      if (Pars.fHybrid != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle using another way of creating abstractions [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.nIterMax != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-x     : toggle XORing outputs of word-level miter [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fShrinkAbs != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fShrinkScratch != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle printing verbose PDR output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Wlc_Par_t Pars, * pPars = &Pars;
    int c;
    Wlc_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "AMXFILdxvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsAdd < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsMul = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsMul < 0 )
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsMux = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsMux < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsFlop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsFlop < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLimit < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fAbs2 ^= 1;
            break;
        case 'x':
            pPars->fXorOutput ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fPdrVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandCone(): There is no current design.\n" );
        return 0;
    }
    Wlc_NtkAbsCore( pNtk, pPars );
    return 0;
usage:
    Abc_Print( -2, "usage: %%abs [-AMXFIL num] [-dxvwh]\n" );
    Abc_Print( -2, "\t         abstraction for word-level networks\n" );
    Abc_Print( -2, "\t-A num : minimum bit-width of an adder/subtractor to abstract [default = %d]\n", pPars->nBitsAdd );
    Abc_Print( -2, "\t-M num : minimum bit-width of a multiplier to abstract [default = %d]\n",        pPars->nBitsMul );
    Abc_Print( -2, "\t-X num : minimum bit-width of a MUX operator to abstract [default = %d]\n",      pPars->nBitsMux );
    Abc_Print( -2, "\t-F num : minimum bit-width of a flip-flop to abstract [default = %d]\n",         pPars->nBitsFlop );
    Abc_Print( -2, "\t-I num : maximum number of CEGAR iterations [default = %d]\n",                   pPars->nIterMax );
    Abc_Print( -2, "\t-L num : maximum number of each type of signals [default = %d]\n",               pPars->nLimit );
    Abc_Print( -2, "\t-d     : toggle using another way of creating abstractions [default = %s]\n",    pPars->fAbs2? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle XORing outputs of word-level miter [default = %s]\n",            pPars->fXorOutput? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                  pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing verbose PDR output [default = %s]\n",                   pPars->fPdrVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}